

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

int Ga2_ManCheckNodesAnd(Gia_Man_t *p,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < (long)vNodes->nSize) {
    lVar4 = 0;
    do {
      iVar2 = vNodes->pArray[lVar4];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return 1;
      }
      pGVar1 = p->pObjs + iVar2;
      uVar3 = *(ulong *)pGVar1;
      if ((-1 < *(long *)(pGVar1 + -(ulong)((uint)uVar3 & 0x1fffffff)) & (byte)(uVar3 >> 0x1d) & 1)
          != 0) {
        return 0;
      }
      if (((uVar3 >> 0x3d & 1) != 0) &&
         (-1 < *(long *)(pGVar1 + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)))) {
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (vNodes->nSize != lVar4);
  }
  return 1;
}

Assistant:

int Ga2_ManCheckNodesAnd( Gia_Man_t * p, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        if ( (!Gia_ObjFanin0(pObj)->fPhase && Gia_ObjFaninC0(pObj)) || 
             (!Gia_ObjFanin1(pObj)->fPhase && Gia_ObjFaninC1(pObj)) )
            return 0;
    return 1;
}